

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::ContainsType
          (ValidationState_t *this,uint32_t id,
          function<bool_(const_spvtools::val::Instruction_*)> *f,bool traverse_all_types)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  Instruction *this_00;
  ulong uVar5;
  size_t index;
  Instruction *local_30;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    return false;
  }
  local_30 = this_00;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar3 = (*f->_M_invoker)((_Any_data *)f,&local_30);
  if (bVar3) {
    return true;
  }
  uVar1 = (this_00->inst_).opcode;
  uVar5 = (ulong)uVar1;
  index = 1;
  if (uVar5 < 0x22) {
    if ((0x3b800000UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_002164d4;
    if ((0x240000000U >> (uVar5 & 0x3f) & 1) != 0) {
      if (uVar1 == 0x21 && !traverse_all_types) {
        return false;
      }
      if ((ulong)((long)(this_00->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
        return false;
      }
      uVar5 = 2;
      do {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,index);
        bVar3 = ContainsType(this,uVar4,f,traverse_all_types);
        if (bVar3) {
          return bVar3;
        }
        bVar2 = uVar5 < (ulong)((long)(this_00->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4);
        index = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar2);
      return bVar3;
    }
    if (uVar5 == 0x20) {
      bVar3 = IsForwardPointer(this,id);
      if (!traverse_all_types || bVar3) {
        return false;
      }
      traverse_all_types = true;
      index = 2;
      goto LAB_002164d4;
    }
  }
  if ((uVar1 != 0x1168) && (uVar1 != 0x14ee)) {
    return false;
  }
LAB_002164d4:
  uVar4 = Instruction::GetOperandAs<unsigned_int>(this_00,index);
  bVar3 = ContainsType(this,uVar4,f,traverse_all_types);
  return bVar3;
}

Assistant:

bool ValidationState_t::ContainsType(
    uint32_t id, const std::function<bool(const Instruction*)>& f,
    bool traverse_all_types) const {
  const auto inst = FindDef(id);
  if (!inst) return false;

  if (f(inst)) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return ContainsType(inst->GetOperandAs<uint32_t>(1u), f,
                          traverse_all_types);
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      if (traverse_all_types) {
        return ContainsType(inst->GetOperandAs<uint32_t>(2u), f,
                            traverse_all_types);
      }
      break;
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct:
      if (inst->opcode() == spv::Op::OpTypeFunction && !traverse_all_types) {
        return false;
      }
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsType(inst->GetOperandAs<uint32_t>(i), f,
                         traverse_all_types)) {
          return true;
        }
      }
      break;
    default:
      break;
  }

  return false;
}